

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_component.cpp
# Opt level: O0

void __thiscall
lsim::ModelComponent::ModelComponent
          (ModelComponent *this,ModelCircuit *parent,uint32_t id,char *circuit_name,uint32_t inputs,
          uint32_t outputs)

{
  allocator local_31;
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t outputs_local;
  uint32_t inputs_local;
  char *circuit_name_local;
  ModelCircuit *pMStack_18;
  uint32_t id_local;
  ModelCircuit *parent_local;
  ModelComponent *this_local;
  
  this->m_circuit = parent;
  this->m_id = id;
  this->m_type = 0x301;
  this->m_inputs = inputs;
  this->m_outputs = outputs;
  this->m_controls = 0;
  local_30 = outputs;
  local_2c = inputs;
  _outputs_local = circuit_name;
  circuit_name_local._4_4_ = id;
  pMStack_18 = parent;
  parent_local = (ModelCircuit *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_nested_name,circuit_name,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this->m_nested_circuit = (ModelCircuit *)0x0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map(&this->m_port_lut);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>_>_>_>
  ::unordered_map(&this->m_properties);
  Point::Point(&this->m_position,0.0,0.0);
  this->m_angle = 0;
  return;
}

Assistant:

ModelComponent::ModelComponent(ModelCircuit *parent, uint32_t id, const char *circuit_name, uint32_t inputs, uint32_t outputs) :
        m_circuit(parent),
        m_id(id),
        m_type(COMPONENT_SUB_CIRCUIT),
        m_inputs(inputs),
        m_outputs(outputs),
        m_controls(0),
        m_nested_name(circuit_name),
        m_nested_circuit(nullptr),
        m_position(0,0),
        m_angle(0) {
}